

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstructCondense.cpp
# Opt level: O2

void __thiscall
TPZDohrSubstructCondense<float>::SolveSystemPhi(TPZDohrSubstructCondense<float> *this)

{
  TPZFMatrix<float> *this_00;
  float fVar1;
  int iVar2;
  float *pfVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong col;
  ulong uVar7;
  TPZFMatrix<float> rhs;
  float local_c4;
  TPZFMatrix<float> local_c0;
  
  uVar7 = (this->fCoarseNodes).fNElements;
  iVar2 = (int)uVar7;
  lVar4 = (long)iVar2;
  local_c4 = 0.0;
  TPZFMatrix<float>::TPZFMatrix(&local_c0,(long)this->fNEquations + (long)iVar2,lVar4,&local_c4);
  uVar6 = 0;
  uVar5 = uVar7 & 0xffffffff;
  if (iVar2 < 1) {
    uVar5 = uVar6;
  }
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    pfVar3 = TPZFMatrix<float>::operator()(&local_c0,(long)this->fNEquations + uVar6,uVar6);
    *pfVar3 = 1.0;
  }
  TPZMatRed<float,_TPZFMatrix<float>_>::SetF(((this->fMatRedComplete).fRef)->fPointer,&local_c0);
  this_00 = &this->fKCi;
  TPZFMatrix<float>::Resize(this_00,lVar4,lVar4);
  TPZMatRed<float,_TPZFMatrix<float>_>::U1(((this->fMatRedComplete).fRef)->fPointer,this_00);
  TPZMatRed<float,_TPZFMatrix<float>_>::UGlobal
            (((this->fMatRedComplete).fRef)->fPointer,this_00,&local_c0);
  for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
    pfVar3 = TPZFMatrix<float>::operator()(this_00,uVar6,uVar6);
    *pfVar3 = *pfVar3 + 10.0;
    for (col = 0; (uVar7 & 0xffffffff) != col; col = col + 1) {
      pfVar3 = TPZFMatrix<float>::operator()(this_00,uVar6,col);
      fVar1 = *pfVar3;
      pfVar3 = TPZFMatrix<float>::operator()(this_00,uVar6,col);
      *pfVar3 = -fVar1;
    }
    pfVar3 = TPZFMatrix<float>::operator()(this_00,uVar6,uVar6);
    (this->fWeights).super_TPZVec<float>.fStore[(this->fCoarseNodes).fStore[uVar6]] = *pfVar3;
  }
  TPZFMatrix<float>::Resize(&this->fPhiC,(long)this->fNEquations,lVar4);
  for (lVar4 = 0; lVar4 < this->fNEquations; lVar4 = lVar4 + 1) {
    for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      pfVar3 = TPZFMatrix<float>::operator()(&local_c0,lVar4,uVar7);
      fVar1 = *pfVar3;
      pfVar3 = TPZFMatrix<float>::operator()(&this->fPhiC,lVar4,uVar7);
      *pfVar3 = fVar1;
    }
  }
  TPZFMatrix<float>::~TPZFMatrix(&local_c0);
  return;
}

Assistant:

void TPZDohrSubstructCondense<TVar>::SolveSystemPhi() {
	int ncoarse = fCoarseNodes.NElements();
	int i,j;
	TPZFMatrix<TVar> rhs(this->fNEquations+ncoarse,ncoarse,0.);
	for(i=0; i<ncoarse; i++)
	{
		rhs(fNEquations+i,i) = 1.;
	}
	fMatRedComplete->SetF(rhs);
	fKCi.Resize(ncoarse,ncoarse);
	fMatRedComplete->U1(fKCi);
	fMatRedComplete->UGlobal(fKCi,rhs);
	for(i=0; i<ncoarse; i++) 
	{
		fKCi(i,i) += 10.;
		for(j=0; j<ncoarse; j++)
		{
			fKCi(i,j) = -fKCi(i,j);
		}
		fWeights[fCoarseNodes[i]] = fKCi(i,i);
	}
	fPhiC.Resize(fNEquations,ncoarse);
	for(i=0; i<fNEquations; i++)
	{
		for(j=0; j<ncoarse; j++)
		{
			fPhiC(i,j) = rhs(i,j);
		}
	}
}